

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

int xmlXIncludeProcessNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  
  iVar1 = -1;
  if ((((node != (xmlNodePtr)0x0) && (node->type != XML_NAMESPACE_DECL)) &&
      (ctxt != (xmlXIncludeCtxtPtr)0x0)) &&
     (((node->doc != (_xmlDoc *)0x0 && (iVar1 = xmlXIncludeDoProcess(ctxt,node), -1 < iVar1)) &&
      (0 < ctxt->nbErrors)))) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
xmlXIncludeProcessNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node) {
    int ret = 0;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL) ||
        (node->doc == NULL) || (ctxt == NULL))
	return(-1);
    ret = xmlXIncludeDoProcessRoot(ctxt, node);
    if ((ret >= 0) && (ctxt->nbErrors > 0))
	ret = -1;
    return(ret);
}